

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

bool __thiscall
deqp::gls::FboUtil::ValidStatusCodes::isFBOStatusValid(ValidStatusCodes *this,GLenum fboStatus)

{
  pointer pRVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (fboStatus == 0x8cd5) {
    return this->m_allowComplete;
  }
  pRVar1 = (this->m_errorStatuses).
           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (int)((long)(this->m_errorStatuses).
                      super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) * -0x49249249;
  if (0 < (int)uVar2) {
    uVar3 = (ulong)(uVar2 & 0x7fffffff);
    uVar4 = 0;
    do {
      if (pRVar1->errorCode == fboStatus) {
        return true;
      }
      uVar4 = uVar4 + 1;
      pRVar1 = pRVar1 + 1;
    } while (uVar3 != uVar4);
    return uVar4 < uVar3;
  }
  return false;
}

Assistant:

bool ValidStatusCodes::isFBOStatusValid (glw::GLenum fboStatus) const
{
	if (fboStatus == GL_FRAMEBUFFER_COMPLETE)
		return m_allowComplete;
	else
	{
		// rule violation exists?
		for (int ndx = 0; ndx < (int)m_errorStatuses.size(); ++ndx)
		{
			if (m_errorStatuses[ndx].errorCode == fboStatus)
				return true;
		}
		return false;
	}
}